

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_info.h
# Opt level: O1

void __thiscall
pybind11::buffer_info::buffer_info
          (buffer_info *this,void *ptr,ssize_t itemsize,string *format,ssize_t ndim,
          any_container<long> *shape_in,any_container<long> *strides_in,bool readonly)

{
  pointer pcVar1;
  pointer plVar2;
  long lVar3;
  long lVar4;
  
  this->ptr = ptr;
  this->itemsize = itemsize;
  this->size = 1;
  (this->format)._M_dataplus._M_p = (pointer)&(this->format).field_2;
  pcVar1 = (format->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->format,pcVar1,pcVar1 + format->_M_string_length);
  this->ndim = ndim;
  (this->shape).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (shape_in->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->shape).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (shape_in->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->shape).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (shape_in->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  (shape_in->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (shape_in->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (shape_in->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->strides).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (strides_in->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->strides).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (strides_in->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->strides).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (strides_in->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (strides_in->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (strides_in->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (strides_in->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->readonly = readonly;
  this->m_view = (Py_buffer *)0x0;
  this->ownview = false;
  plVar2 = (this->shape).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((long)(this->shape).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)plVar2 >> 3 == ndim) &&
     ((long)(this->strides).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->strides).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 == ndim)) {
    if (ndim != 0) {
      lVar3 = this->size;
      lVar4 = 0;
      do {
        lVar3 = lVar3 * plVar2[lVar4];
        this->size = lVar3;
        lVar4 = lVar4 + 1;
      } while (ndim != lVar4);
    }
    return;
  }
  pybind11_fail("buffer_info: ndim doesn\'t match shape and/or strides length");
}

Assistant:

buffer_info(void *ptr, ssize_t itemsize, const std::string &format, ssize_t ndim,
                detail::any_container<ssize_t> shape_in, detail::any_container<ssize_t> strides_in, bool readonly=false)
    : ptr(ptr), itemsize(itemsize), size(1), format(format), ndim(ndim),
      shape(std::move(shape_in)), strides(std::move(strides_in)), readonly(readonly) {
        if (ndim != (ssize_t) shape.size() || ndim != (ssize_t) strides.size())
            pybind11_fail("buffer_info: ndim doesn't match shape and/or strides length");
        for (size_t i = 0; i < (size_t) ndim; ++i)
            size *= shape[i];
    }